

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O1

bool slang::syntax::SyntaxFacts::isNotInConcatenationExpr(TokenKind kind)

{
  uint uVar1;
  undefined2 in_register_0000003a;
  
  if (CONCAT22(in_register_0000003a,kind) < 0x8a) {
    if ((CONCAT22(in_register_0000003a,kind) < 0x28) &&
       ((0x8000200002U >> ((ulong)CONCAT22(in_register_0000003a,kind) & 0x3f) & 1) != 0)) {
      return true;
    }
  }
  else {
    uVar1 = CONCAT22(in_register_0000003a,kind) - 0x8a;
    if ((((uVar1 < 0x2e) && ((0x200800000003U >> ((ulong)uVar1 & 0x3f) & 1) != 0)) ||
        (CONCAT22(in_register_0000003a,kind) == 0x119)) ||
       (CONCAT22(in_register_0000003a,kind) == 0x13c)) {
      return true;
    }
  }
  return false;
}

Assistant:

bool SyntaxFacts::isNotInConcatenationExpr(TokenKind kind) {
    switch (kind) {
        case TokenKind::Semicolon:
        case TokenKind::EndOfFile:
        case TokenKind::IfKeyword:
        case TokenKind::ForeachKeyword:
        case TokenKind::SoftKeyword:
        case TokenKind::UniqueKeyword:
        case TokenKind::DistKeyword:
        case TokenKind::DisableKeyword:
        case TokenKind::MinusArrow:
            return true;
        default:
            return false;
    }
}